

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

bool __thiscall
httplib::Server::set_mount_point(Server *this,string *mount_point,string *dir,Headers *headers)

{
  bool bVar1;
  string mnt;
  char *local_b0;
  long local_a8;
  undefined1 local_90 [72];
  _Rb_tree_header local_48;
  
  bVar1 = detail::is_dir(dir);
  if (bVar1) {
    if (mount_point->_M_string_length == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,"/",(allocator<char> *)local_90);
    }
    else {
      std::__cxx11::string::string((string *)&local_b0,(string *)mount_point);
    }
    if ((local_a8 != 0) && (*local_b0 == '/')) {
      std::__cxx11::string::string((string *)local_90,(string *)&local_b0);
      std::__cxx11::string::string((string *)(local_90 + 0x20),(string *)dir);
      std::_Rb_tree_header::_Rb_tree_header
                (&local_48,&(headers->_M_t)._M_impl.super__Rb_tree_header);
      std::
      vector<httplib::Server::MountPointEntry,_std::allocator<httplib::Server::MountPointEntry>_>::
      emplace_back<httplib::Server::MountPointEntry>(&this->base_dirs_,(MountPointEntry *)local_90);
      MountPointEntry::~MountPointEntry((MountPointEntry *)local_90);
      std::__cxx11::string::~string((string *)&local_b0);
      return true;
    }
    std::__cxx11::string::~string((string *)&local_b0);
  }
  return false;
}

Assistant:

inline bool Server::set_mount_point(const std::string &mount_point,
                                    const std::string &dir, Headers headers) {
  if (detail::is_dir(dir)) {
    std::string mnt = !mount_point.empty() ? mount_point : "/";
    if (!mnt.empty() && mnt[0] == '/') {
      base_dirs_.push_back({mnt, dir, std::move(headers)});
      return true;
    }
  }
  return false;
}